

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetWritable
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  Type *oldType;
  ScriptContext *this_00;
  JavascriptLibrary *pJVar1;
  uint32 uVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  DynamicTypeHandler *pDVar6;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_48;
  uint32 local_3c;
  PropertyIndex local_36;
  uint32 indexVal;
  PropertyIndex index;
  
  BVar4 = GetDescriptor(this,propertyId,&local_36);
  oldType = (instance->super_RecyclableObject).type.ptr;
  indexVal = propertyId;
  if (BVar4 == 0) {
    this_00 = (((oldType->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    bVar3 = DynamicObject::HasObjectArray(instance);
    uVar2 = indexVal;
    iVar5 = 1;
    if (bVar3) {
      BVar4 = ScriptContext::IsNumericPropertyId(this_00,indexVal,&local_3c);
      if (BVar4 != 0) {
        pDVar6 = ConvertToTypeWithItemAttributes(this,instance);
        iVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x2a])
                          (pDVar6,instance,(ulong)uVar2,(ulong)(uint)value);
      }
    }
  }
  else if (value == 0) {
    BVar4 = ClearAttribute(this,instance,local_36,'\x04');
    iVar5 = 1;
    if (BVar4 != 0) {
      DynamicObject::ChangeTypeIf(instance,oldType);
      pDVar6 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
      pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
      WriteBarrierSet(&local_48,&pJVar1->typesWithOnlyWritablePropertyProtoChain);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                (local_48.ptr,pDVar6,'\0',indexVal,
                 (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr);
    }
  }
  else {
    BVar4 = SetAttribute(this,instance,local_36,'\x04');
    iVar5 = 1;
    if (BVar4 != 0) {
      DynamicObject::ChangeTypeIf(instance,oldType);
    }
  }
  return iVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler* const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }